

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O3

BYTE * __thiscall FHealthBar::GetColumn(FHealthBar *this,uint column,Span **spans_out)

{
  uint uVar1;
  
  if (this->NeedRefresh == true) {
    MakeTexture(this);
  }
  uVar1 = 199;
  if (column < 199) {
    uVar1 = column;
  }
  if (spans_out != (Span **)0x0) {
    *spans_out = DummySpan + ((uint)(this->VialLevel * 2) <= uVar1);
  }
  return &(this->super_FTexture).field_0x54 + (ulong)uVar1 * 2;
}

Assistant:

const BYTE *FHealthBar::GetColumn (unsigned int column, const Span **spans_out)
{
	if (NeedRefresh)
	{
		MakeTexture ();
	}
	if (column > 199)
	{
		column = 199;
	}
	if (spans_out != NULL)
	{
		*spans_out = &DummySpan[column >= (unsigned int)VialLevel*2];
	}
	return Pixels + column*2;
}